

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value-types.cc
# Opt level: O0

half tinyusdz::value::anon_unknown_0::float_to_half_full_be(float _f)

{
  short sVar1;
  int iVar2;
  uint uVar3;
  uint mant;
  int newexp;
  float16be o;
  FP32be f;
  float _f_local;
  half ret;
  
  mant._0_2_ = 0;
  if (((uint)_f >> 1 & 0xff) == 0) {
    mant._0_2_ = 0;
  }
  else if (((uint)_f >> 1 & 0xff) == 0xff) {
    sVar1 = 0;
    if ((uint)_f >> 9 != 0) {
      sVar1 = 0x200;
    }
    mant._0_2_ = sVar1 << 6 | 0x3e;
  }
  else {
    iVar2 = ((uint)_f >> 1 & 0xff) - 0x70;
    if (iVar2 < 0x1f) {
      if (iVar2 < 1) {
        if ((0xe - iVar2 < 0x19) &&
           (uVar3 = (uint)_f >> 9 | 0x800000,
           mant._0_2_ = (short)(uVar3 >> (0xeU - (char)iVar2 & 0x1f)) * 0x40,
           (uVar3 >> (0xdU - (char)iVar2 & 0x1f) & 1) != 0)) {
          mant._0_2_ = (ushort)mant + 1;
        }
      }
      else {
        mant._0_2_ = ((ushort)iVar2 & 0x1f) << 1 | (short)((int)((uint)_f >> 9) >> 0xd) << 6;
        if (((uint)_f >> 9 & 0x1000) != 0) {
          mant._0_2_ = (ushort)mant + 1;
        }
      }
    }
    else {
      mant._0_2_ = 0x3e;
    }
  }
  return (half)((ushort)mant & 0xfffe | SUB42(_f,0) & 1);
}

Assistant:

half float_to_half_full_be(float _f) {
  FP32be f;
  f.f = _f;
  float16be o = {0};

  // Based on ISPC reference code (with minor modifications)
  if (f.s.Exponent == 0)  // Signed zero/denormal (which will underflow)
    o.s.Exponent = 0;
  else if (f.s.Exponent == 255)  // Inf or NaN (all exponent bits set)
  {
    o.s.Exponent = 31;
    o.s.Mantissa = f.s.Mantissa ? 0x200 : 0;  // NaN->qNaN and Inf->Inf
  } else                                      // Normalized number
  {
    // Exponent unbias the single, then bias the halfp
    int newexp = f.s.Exponent - 127 + 15;
    if (newexp >= 31)  // Overflow, return signed infinity
      o.s.Exponent = 31;
    else if (newexp <= 0)  // Underflow
    {
      if ((14 - newexp) <= 24)  // Mantissa might be non-zero
      {
        unsigned int mant = f.s.Mantissa | 0x800000;  // Hidden 1 bit
        o.s.Mantissa = mant >> (14 - newexp);
        if ((mant >> (13 - newexp)) & 1)  // Check for rounding
          o.u++;  // Round, might overflow into exp bit, but this is OK
      }
    } else {
      o.s.Exponent = static_cast<unsigned int>(newexp);
      o.s.Mantissa = f.s.Mantissa >> 13;
      if (f.s.Mantissa & 0x1000)  // Check for rounding
        o.u++;                    // Round, might overflow to inf, this is OK
    }
  }

  o.s.Sign = f.s.Sign;

  half ret;
  ret.value = (*reinterpret_cast<const uint16_t *>(&o));

  return ret;
}